

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void dump(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *points,vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> *clusters)

{
  pointer pCVar1;
  pointer puVar2;
  unsigned_long *index;
  pointer puVar3;
  ulong uVar4;
  pointer pvVar5;
  size_t k;
  ulong uVar6;
  
  uVar4 = 0;
  while( true ) {
    pCVar1 = (clusters->
             super__Vector_base<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(clusters->
                       super__Vector_base<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0x30) <= uVar4)
    break;
    puVar2 = *(pointer *)
              ((long)&pCVar1[uVar4].members.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8)
    ;
    for (puVar3 = pCVar1[uVar4].members.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1) {
      pvVar5 = (points->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + *puVar3;
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      for (uVar6 = 0;
          uVar6 < (ulong)((long)*(pointer *)
                                 ((long)&(pvVar5->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data + 8) -
                          *(long *)&(pvVar5->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data >> 3); uVar6 = uVar6 + 1) {
        std::operator<<((ostream *)&std::cout," ");
        std::ostream::_M_insert<double>
                  (*(double *)
                    (*(long *)&(pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                               .super__Vector_impl_data + uVar6 * 8));
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void dump(const std::vector<Container>& points,
    const std::vector<msc::Cluster<Scalar>>& clusters)
{
    for (std::size_t c = 0; c < clusters.size(); c++)
    {
        for (const auto& index : clusters[c].members)
        {
            const auto& point = points[index];
            std::cout << c;
            for (std::size_t k = 0; k < point.size(); k++)
                std::cout << " " << point[k];
            std::cout << std::endl;
        }
    }
}